

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::RGBFilm::AddSplat(RGBFilm *this,Point2f *p,SampledSpectrum L,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  float fVar2;
  Point2i p_00;
  bool bVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  ulong uVar5;
  Pixel *pPVar6;
  int iVar7;
  int iVar8;
  Bounds2<int> *pBVar9;
  AtomicDouble *this_00;
  int i;
  long lVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  Float FVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  float fVar22;
  undefined1 auVar23 [16];
  RGB RVar24;
  initializer_list<float> __l;
  Bounds2iIterator BVar25;
  Bounds2iIterator __begin1;
  undefined8 local_70;
  undefined1 local_68 [16];
  SampledSpectrum L_local;
  Bounds2<int> local_40;
  undefined1 auVar18 [56];
  
  local_40.pMax.super_Tuple2<pbrt::Point2,_int>.y = local_40.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  auVar21._8_56_ = L._16_56_;
  auVar21._0_8_ = L.values.values._8_8_;
  auVar16._8_56_ = L._8_56_;
  auVar16._0_8_ = L.values.values._0_8_;
  L_local.values.values = (array<float,_4>)vmovlhps_avx(auVar16._0_16_,auVar21._0_16_);
  auVar18 = ZEXT856(L_local.values.values._8_8_);
  bVar3 = SampledSpectrum::HasNaNs(&L_local);
  if (!bVar3) {
    RVar24 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,&L_local,lambda);
    fVar19 = RVar24.b;
    auVar17._0_8_ = RVar24._0_8_;
    auVar17._8_56_ = auVar18;
    uVar1 = vmovlps_avx(auVar17._0_16_);
    local_40.pMax.super_Tuple2<pbrt::Point2,_int>.x = (int)fVar19;
    local_40.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar1;
    local_40.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)((ulong)uVar1 >> 0x20);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_40;
    fVar12 = std::max<float>(__l);
    fVar13 = this->maxComponentValue / fVar12;
    auVar11 = vmovshdup_avx(auVar17._0_16_);
    bVar3 = this->maxComponentValue < fVar12;
    local_68._4_12_ = auVar11._4_12_;
    local_68._0_4_ = (uint)bVar3 * (int)(auVar11._0_4_ * fVar13) + (uint)!bVar3 * (int)auVar11._0_4_
    ;
    uVar5 = *(ulong *)((this->super_FilmBase).filter.
                       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                       .bits & 0xffffffffffff);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar5;
    fVar12 = (p->super_Tuple2<pbrt::Point2,_float>).x + 0.5;
    fVar2 = (p->super_Tuple2<pbrt::Point2,_float>).y + 0.5;
    auVar11 = vmovshdup_avx(auVar11);
    fVar22 = (float)uVar5;
    auVar23 = ZEXT416((uint)(fVar12 - fVar22));
    auVar23 = vroundss_avx(auVar23,auVar23,9);
    auVar15 = ZEXT416((uint)(fVar2 - auVar11._0_4_));
    auVar15 = vroundss_avx(auVar15,auVar15,9);
    auVar20 = ZEXT416((uint)(fVar12 + fVar22));
    auVar20 = vroundss_avx(auVar20,auVar20,9);
    auVar11 = ZEXT416((uint)(fVar2 + auVar11._0_4_));
    auVar11 = vroundss_avx(auVar11,auVar11,9);
    iVar7 = (int)auVar23._0_4_;
    iVar8 = (int)auVar15._0_4_;
    local_40.pMax.super_Tuple2<pbrt::Point2,_int>.x = (int)auVar20._0_4_ + 1;
    local_40.pMax.super_Tuple2<pbrt::Point2,_int>.y = (int)auVar11._0_4_ + 1;
    local_40.pMin.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    if (local_40.pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar7) {
      local_40.pMin.super_Tuple2<pbrt::Point2,_int>.x =
           local_40.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    }
    local_40.pMin.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
    if (local_40.pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar8) {
      local_40.pMin.super_Tuple2<pbrt::Point2,_int>.y =
           local_40.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    }
    if (local_40.pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar7) {
      local_40.pMax.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
    }
    if (local_40.pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar8) {
      local_40.pMax.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
    }
    local_40 = Intersect<int>(&local_40,&(this->super_FilmBase).pixelBounds);
    TVar4 = (Tuple2<pbrt::Point2,_int>)local_40.pMin.super_Tuple2<pbrt::Point2,_int>;
    __begin1.p.super_Tuple2<pbrt::Point2,_int> = TVar4;
    __begin1.bounds = &local_40;
    BVar25 = pbrt::end(&local_40);
    uVar5 = (ulong)TVar4 >> 0x20;
    pBVar9 = &local_40;
    while (((p_00.super_Tuple2<pbrt::Point2,_int> = __begin1.p.super_Tuple2<pbrt::Point2,_int>,
            TVar4.x != BVar25.p.super_Tuple2<pbrt::Point2,_int>.x ||
            ((int)uVar5 != BVar25.p.super_Tuple2<pbrt::Point2,_int>.y)) || (pBVar9 != BVar25.bounds)
           )) {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar15._8_8_ = 0;
      auVar15._0_4_ = __begin1.p.super_Tuple2<pbrt::Point2,_int>.x;
      auVar15._4_4_ = __begin1.p.super_Tuple2<pbrt::Point2,_int>.y;
      auVar11 = vcvtdq2ps_avx(auVar15);
      auVar11 = vsubps_avx(auVar20,auVar11);
      auVar23._8_4_ = 0xbf000000;
      auVar23._0_8_ = 0xbf000000bf000000;
      auVar23._12_4_ = 0xbf000000;
      auVar11 = vaddps_avx512vl(auVar11,auVar23);
      local_70 = vmovlps_avx(auVar11);
      FVar14 = TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
               ::
               Dispatch<pbrt::FilterHandle::Evaluate(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                           *)&(this->super_FilmBase).filter,(Point2f *)&local_70);
      if ((FVar14 != 0.0) || (NAN(FVar14))) {
        pPVar6 = Array2D<pbrt::RGBFilm::Pixel>::operator[](&this->pixels,p_00);
        this_00 = pPVar6->splatRGB;
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          fVar12 = (float)((uint)bVar3 * (int)(RVar24.r * fVar13) + (uint)!bVar3 * (int)RVar24.r);
          if (((int)lVar10 != 0) && (fVar12 = (float)local_68._0_4_, (int)lVar10 != 1)) {
            fVar12 = (float)((uint)bVar3 * (int)(fVar19 * fVar13) + (uint)!bVar3 * (int)fVar19);
          }
          AtomicDouble::Add(this_00,(double)(fVar12 * FVar14));
          this_00 = this_00 + 1;
        }
      }
      Bounds2iIterator::operator++(&__begin1);
      TVar4 = __begin1.p.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
      uVar5 = (ulong)__begin1.p.super_Tuple2<pbrt::Point2,_int> >> 0x20;
      pBVar9 = __begin1.bounds;
    }
    return;
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/film.cpp"
             ,0x1e0,"Check failed: %s",(char (*) [13])"!L.HasNaNs()");
}

Assistant:

void RGBFilm::AddSplat(const Point2f &p, SampledSpectrum L,
                       const SampledWavelengths &lambda) {
    CHECK(!L.HasNaNs());
    // Convert sample radiance to _PixelSensor_ RGB
    RGB rgb = sensor->ToSensorRGB(L, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue) {
        rgb *= maxComponentValue / m;
    }

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}